

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_socket.cpp
# Opt level: O3

int __thiscall booster::aio::basic_socket::open(basic_socket *this,char *__file,int __oflag,...)

{
  error_category *peVar1;
  int iVar2;
  int extraout_EAX;
  int *piVar3;
  int *in_RCX;
  int __type;
  error_code etmp;
  undefined4 local_38 [2];
  undefined8 local_30;
  
  iVar2 = 0;
  if ((uint)__file < 3) {
    iVar2 = *(int *)(&DAT_001ab660 + ((ulong)__file & 0xffffffff) * 4);
  }
  __type = 1;
  if (__oflag != 0) {
    __type = (uint)(__oflag == 1) * 2;
  }
  local_38[0] = 0;
  local_30 = std::_V2::system_category();
  basic_io_device::close(&this->super_basic_io_device,(int)local_38);
  iVar2 = socket(iVar2,__type,0);
  if (iVar2 == -1) {
    piVar3 = __errno_location();
    peVar1 = syscat;
    iVar2 = *piVar3;
    *in_RCX = iVar2;
    *(error_category **)(in_RCX + 2) = peVar1;
  }
  else {
    basic_io_device::assign(&this->super_basic_io_device,iVar2);
    iVar2 = extraout_EAX;
  }
  return iVar2;
}

Assistant:

void basic_socket::open(family_type d,socket_type t,system::error_code &e)
{
	int domain=0;
	switch(d) {
	case pf_unix: domain=AF_UNIX; break;
	case pf_inet: domain=AF_INET; break;
	case pf_inet6: domain = AF_INET6; break;
	}
	int type = 0;
	switch(t) {
	case sock_stream: type = SOCK_STREAM; break;
	case sock_datagram: type = SOCK_DGRAM; break;
	}

	{
		system::error_code etmp;
		close(etmp);
	}
	native_type fd = ::socket(domain,type,0);
	if(fd == invalid_socket) {
		e=geterror();
		return;
	}
	assign(fd);
}